

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPointSizeTests.cpp
# Opt level: O0

bool vkt::tessellation::anon_unknown_1::verifyImage
               (TestLog *log,ConstPixelBufferAccess *image,int expectedSize)

{
  bool bVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  MessageBuilder *pMVar6;
  int *piVar7;
  int local_69c;
  MessageBuilder local_698;
  MessageBuilder local_518;
  undefined1 local_398 [8];
  undefined1 local_390 [8];
  Vector<int,_2> local_388;
  IVec2 pointSize;
  Vector<int,_4> local_200;
  undefined1 local_1f0 [24];
  int x;
  int y;
  Vec4 black;
  IVec4 resultArea;
  bool resultAreaFound;
  MessageBuilder local_1a8;
  int local_24;
  ConstPixelBufferAccess *pCStack_20;
  int expectedSize_local;
  ConstPixelBufferAccess *image_local;
  TestLog *log_local;
  
  local_24 = expectedSize;
  pCStack_20 = image;
  image_local = (ConstPixelBufferAccess *)log;
  tcu::TestLog::operator<<(&local_1a8,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_1a8,(char (*) [42])"Verifying rendered point size. Expecting ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_24);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])0x12fcdad);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  bVar1 = false;
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(black.m_data + 2));
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&x,0.0,0.0,0.0,1.0);
  for (local_1f0._20_4_ = 0; uVar2 = local_1f0._20_4_,
      iVar4 = tcu::ConstPixelBufferAccess::getHeight(image), (int)uVar2 < iVar4;
      local_1f0._20_4_ = local_1f0._20_4_ + 1) {
    for (local_1f0._16_4_ = 0; uVar2 = local_1f0._16_4_,
        iVar4 = tcu::ConstPixelBufferAccess::getWidth(image), (int)uVar2 < iVar4;
        local_1f0._16_4_ = local_1f0._16_4_ + 1) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_1f0,(int)image,local_1f0._16_4_,local_1f0._20_4_);
      bVar3 = tcu::Vector<float,_4>::operator!=
                        ((Vector<float,_4> *)local_1f0,(Vector<float,_4> *)&x);
      if (bVar3) {
        if (bVar1) {
          piVar7 = tcu::Vector<int,_4>::x((Vector<int,_4> *)(black.m_data + 2));
          iVar4 = de::min<int>(*piVar7,local_1f0._16_4_);
          piVar7 = tcu::Vector<int,_4>::x((Vector<int,_4> *)(black.m_data + 2));
          *piVar7 = iVar4;
          piVar7 = tcu::Vector<int,_4>::y((Vector<int,_4> *)(black.m_data + 2));
          iVar4 = de::min<int>(*piVar7,local_1f0._20_4_);
          piVar7 = tcu::Vector<int,_4>::y((Vector<int,_4> *)(black.m_data + 2));
          *piVar7 = iVar4;
          piVar7 = tcu::Vector<int,_4>::z((Vector<int,_4> *)(black.m_data + 2));
          iVar4 = de::max<int>(*piVar7,local_1f0._16_4_ + 1);
          piVar7 = tcu::Vector<int,_4>::z((Vector<int,_4> *)(black.m_data + 2));
          *piVar7 = iVar4;
          piVar7 = tcu::Vector<int,_4>::w((Vector<int,_4> *)(black.m_data + 2));
          iVar4 = de::max<int>(*piVar7,local_1f0._20_4_ + 1);
          piVar7 = tcu::Vector<int,_4>::w((Vector<int,_4> *)(black.m_data + 2));
          *piVar7 = iVar4;
        }
        else {
          tcu::Vector<int,_4>::Vector
                    (&local_200,local_1f0._16_4_,local_1f0._20_4_,local_1f0._16_4_ + 1,
                     local_1f0._20_4_ + 1);
          black.m_data[2] = (float)local_200.m_data[0];
          black.m_data[3] = (float)local_200.m_data[1];
          bVar1 = true;
        }
      }
    }
  }
  if (bVar1) {
    tcu::Vector<int,_4>::swizzle((Vector<int,_4> *)local_390,(int)&black + 8,2);
    tcu::Vector<int,_4>::swizzle((Vector<int,_4> *)local_398,(int)&black + 8,0);
    tcu::operator-((tcu *)&local_388,(Vector<int,_2> *)local_390,(Vector<int,_2> *)local_398);
    iVar4 = tcu::Vector<int,_2>::x(&local_388);
    iVar5 = tcu::Vector<int,_2>::y(&local_388);
    if (iVar4 == iVar5) {
      iVar4 = tcu::Vector<int,_2>::x(&local_388);
      if (iVar4 == local_24) {
        log_local._7_1_ = true;
      }
      else {
        tcu::TestLog::operator<<
                  (&local_698,(TestLog *)image_local,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_698,(char (*) [37])"ERROR! Point size invalid, expected ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_24);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])0x1386d38);
        local_69c = tcu::Vector<int,_2>::x(&local_388);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_69c);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_698);
        log_local._7_1_ = false;
      }
    }
    else {
      tcu::TestLog::operator<<
                (&local_518,(TestLog *)image_local,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_518,
                          (char (*) [57])"ERROR! Rasterized point is not a square. Point size was ")
      ;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_388);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_518);
      log_local._7_1_ = false;
    }
  }
  else {
    tcu::TestLog::operator<<
              ((MessageBuilder *)&pointSize,(TestLog *)image_local,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&pointSize,
                        (char (*) [57])"Verification failed, could not find any point fragments.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&pointSize);
    log_local._7_1_ = false;
  }
  return log_local._7_1_;
}

Assistant:

bool verifyImage (tcu::TestLog& log, const tcu::ConstPixelBufferAccess image, const int expectedSize)
{
	log << tcu::TestLog::Message << "Verifying rendered point size. Expecting " << expectedSize << " pixels." << tcu::TestLog::EndMessage;

	bool			resultAreaFound	= false;
	tcu::IVec4		resultArea;
	const tcu::Vec4	black(0.0, 0.0, 0.0, 1.0);

	// Find rasterization output area

	for (int y = 0; y < image.getHeight(); ++y)
	for (int x = 0; x < image.getWidth();  ++x)
		if (image.getPixel(x, y) != black)
		{
			if (!resultAreaFound)
			{
				// first fragment
				resultArea = tcu::IVec4(x, y, x + 1, y + 1);
				resultAreaFound = true;
			}
			else
			{
				// union area
				resultArea.x() = de::min(resultArea.x(), x);
				resultArea.y() = de::min(resultArea.y(), y);
				resultArea.z() = de::max(resultArea.z(), x+1);
				resultArea.w() = de::max(resultArea.w(), y+1);
			}
		}

	if (!resultAreaFound)
	{
		log << tcu::TestLog::Message << "Verification failed, could not find any point fragments." << tcu::TestLog::EndMessage;
		return false;
	}

	const tcu::IVec2 pointSize = resultArea.swizzle(2,3) - resultArea.swizzle(0, 1);

	if (pointSize.x() != pointSize.y())
	{
		log << tcu::TestLog::Message << "ERROR! Rasterized point is not a square. Point size was " << pointSize << tcu::TestLog::EndMessage;
		return false;
	}

	if (pointSize.x() != expectedSize)
	{
		log << tcu::TestLog::Message << "ERROR! Point size invalid, expected " << expectedSize << ", got " << pointSize.x() << tcu::TestLog::EndMessage;
		return false;
	}

	return true;
}